

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::accessChainStore(Builder *this,Id rvalue)

{
  Id lValue;
  Id IVar1;
  Id typeId;
  size_type sVar2;
  Id local_34;
  Id tempBaseId_1;
  Id tempBaseId;
  Id source;
  Id base;
  Id rvalue_local;
  Builder *this_local;
  
  if (((this->accessChain).isRValue & 1U) == 0) {
    transferAccessChainSwizzle(this,true);
    lValue = collapseAccessChain(this);
    tempBaseId_1 = 0;
    sVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar2 != 0) {
      IVar1 = createLoad(this,lValue);
      typeId = getTypeId(this,IVar1);
      tempBaseId_1 = createLvalueSwizzle(this,typeId,IVar1,rvalue,&(this->accessChain).swizzle);
    }
    if ((this->accessChain).component != 0) {
      if (tempBaseId_1 == 0) {
        local_34 = createLoad(this,lValue);
      }
      else {
        local_34 = tempBaseId_1;
      }
      IVar1 = getTypeId(this,local_34);
      tempBaseId_1 = createVectorInsertDynamic
                               (this,local_34,IVar1,rvalue,(this->accessChain).component);
    }
    if (tempBaseId_1 == 0) {
      tempBaseId_1 = rvalue;
    }
    createStore(this,tempBaseId_1,lValue);
    return;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x94e,"void spv::Builder::accessChainStore(Id)");
}

Assistant:

void Builder::accessChainStore(Id rvalue)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);
    Id base = collapseAccessChain();

    // If swizzle still exists, it is out-of-order or not full, we must load the target vector,
    // extract and insert elements to perform writeMask and/or swizzle.
    Id source = NoResult;
    if (accessChain.swizzle.size()) {
        Id tempBaseId = createLoad(base);
        source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, rvalue, accessChain.swizzle);
    }

    // dynamic component selection
    if (accessChain.component != NoResult) {
        Id tempBaseId = (source == NoResult) ? createLoad(base) : source;
        source = createVectorInsertDynamic(tempBaseId, getTypeId(tempBaseId), rvalue, accessChain.component);
    }

    if (source == NoResult)
        source = rvalue;

    createStore(source, base);
}